

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,uint *args,uint *args_1,unsigned_long *args_2)

{
  Printer *this_00;
  long lVar1;
  size_t sVar2;
  long *plVar3;
  Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args_00;
  string_view format_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  long *local_80 [2];
  long local_70 [3];
  char *local_58;
  char local_50 [32];
  
  this_00 = this->printer_;
  lVar1 = absl::lts_20240722::numbers_internal::FastIntToBuffer(*args,local_50);
  local_70[2] = lVar1 - (long)local_50;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_58 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,local_50,lVar1);
  lVar1 = absl::lts_20240722::numbers_internal::FastIntToBuffer(*args_1,local_50);
  local_70[2] = lVar1 - (long)local_50;
  local_a0[0] = local_90;
  local_58 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,local_50,lVar1);
  lVar1 = absl::lts_20240722::numbers_internal::FastIntToBuffer(*args_2,local_50);
  local_70[2] = lVar1 - (long)local_50;
  plVar3 = local_70;
  local_80[0] = plVar3;
  local_58 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,local_50,lVar1);
  sVar2 = strlen(format);
  args_00.len_ = 3;
  args_00.ptr_ = &local_c0;
  format_00._M_str = format;
  format_00._M_len = sVar2;
  io::Printer::
  FormatInternal<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (this_00,args_00,&this->vars_,format_00);
  lVar1 = -0x60;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }